

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

bool __thiscall QGraphicsScene::focusNextPrevChild(QGraphicsScene *this,bool next)

{
  long lVar1;
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *pQVar2;
  bool bVar3;
  GraphicsItemFlags GVar4;
  FocusPolicy FVar5;
  QGraphicsItem *pQVar6;
  QGraphicsWidget *pQVar7;
  long lVar8;
  QGraphicsScenePrivate *d;
  QGraphicsWidget *pQVar9;
  
  lVar1 = *(long *)(this + 8);
  this_00 = *(QGraphicsItem **)(lVar1 + 0x188 + (ulong)(*(int *)(lVar1 + 0x1b8) < 1) * 0x10);
  if (this_00 == (QGraphicsItem *)0x0) {
    if ((*(QGraphicsItem **)(lVar1 + 400) != (QGraphicsItem *)0x0) &&
       (bVar3 = QGraphicsItem::isWidget(*(QGraphicsItem **)(lVar1 + 400)), !bVar3)) {
      pQVar6 = *(QGraphicsItem **)(lVar1 + 400);
LAB_0060d7fb:
      setFocusItem(this,pQVar6,BacktabFocusReason - next);
      return true;
    }
    if (*(QGraphicsItem **)(lVar1 + 0x1a8) != (QGraphicsItem *)0x0) {
      GVar4 = QGraphicsItem::flags(*(QGraphicsItem **)(lVar1 + 0x1a8));
      pQVar6 = *(QGraphicsItem **)(lVar1 + 0x1a8);
      if (((uint)GVar4.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                 super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0)
      goto LAB_0060d7fb;
      bVar3 = QGraphicsItem::isWidget(pQVar6);
      if (bVar3) {
        lVar8 = *(long *)(lVar1 + 0x1a8) + -0x10;
        if (*(long *)(lVar1 + 0x1a8) == 0) {
          lVar8 = 0;
        }
        pQVar9 = *(QGraphicsWidget **)(*(long *)(lVar8 + 0x18) + 0x1c0 + (ulong)!next * 8);
        do {
          FVar5 = QGraphicsWidget::focusPolicy(pQVar9);
          if ((FVar5 & TabFocus) != NoFocus) {
            pQVar6 = (QGraphicsItem *)(pQVar9 + 0x10);
            goto LAB_0060d82f;
          }
          pQVar9 = *(QGraphicsWidget **)(*(long *)(pQVar9 + 0x18) + (ulong)!next * 8 + 0x1c0);
          pQVar7 = pQVar9 + 0x10;
          if (pQVar9 == (QGraphicsWidget *)0x0) {
            pQVar7 = (QGraphicsWidget *)0x0;
          }
        } while (pQVar7 != *(QGraphicsWidget **)(lVar1 + 0x1a8));
      }
    }
    pQVar9 = *(QGraphicsWidget **)(lVar1 + 0x1a0);
    if (pQVar9 == (QGraphicsWidget *)0x0) {
      return false;
    }
    pQVar7 = pQVar9;
    if (!next) {
      pQVar9 = *(QGraphicsWidget **)(*(long *)(pQVar9 + 0x18) + 0x1c8);
      pQVar7 = pQVar9;
    }
  }
  else {
    bVar3 = QGraphicsItem::isWidget(this_00);
    if (!bVar3) {
      return false;
    }
    pQVar2 = (this_00->d_ptr).d;
    if (next) {
      pQVar9 = (QGraphicsWidget *)pQVar2[1].needsRepaint.yp;
      pQVar6 = QGraphicsItem::panel((QGraphicsItem *)(pQVar9 + 0x10));
      pQVar7 = pQVar9;
      if ((pQVar6 == (QGraphicsItem *)0x0) && (pQVar9 == *(QGraphicsWidget **)(lVar1 + 0x1a0))) {
        return false;
      }
    }
    else {
      pQVar9 = (QGraphicsWidget *)pQVar2[1].needsRepaint.w;
      pQVar6 = QGraphicsItem::panel((QGraphicsItem *)(pQVar9 + 0x10));
      pQVar7 = pQVar9;
      if ((pQVar6 == (QGraphicsItem *)0x0) &&
         (pQVar9 == *(QGraphicsWidget **)(*(long *)(*(long *)(lVar1 + 0x1a0) + 0x18) + 0x1c8))) {
        return false;
      }
    }
  }
  while( true ) {
    pQVar6 = (QGraphicsItem *)(pQVar9 + 0x10);
    GVar4 = QGraphicsItem::flags(pQVar6);
    if ((((((uint)GVar4.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                  super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0) &&
         (bVar3 = QGraphicsItem::isEnabled(pQVar6), bVar3)) &&
        (bVar3 = QGraphicsItem::isVisibleTo(pQVar6,(QGraphicsItem *)0x0), bVar3)) &&
       ((FVar5 = QGraphicsWidget::focusPolicy(pQVar9), (FVar5 & TabFocus) != NoFocus &&
        (((this_00 == (QGraphicsItem *)0x0 || (bVar3 = QGraphicsItem::isPanel(this_00), !bVar3)) ||
         (bVar3 = QGraphicsItem::isAncestorOf(this_00,pQVar6), bVar3)))))) break;
    if (next) {
      pQVar9 = *(QGraphicsWidget **)(*(long *)(pQVar9 + 0x18) + 0x1c0);
      if (pQVar9 == *(QGraphicsWidget **)(lVar1 + 0x1a0)) {
        return false;
      }
    }
    else {
      pQVar9 = *(QGraphicsWidget **)(*(long *)(pQVar9 + 0x18) + 0x1c8);
      if (pQVar9 == *(QGraphicsWidget **)
                     (*(long *)(*(QGraphicsWidget **)(lVar1 + 0x1a0) + 0x18) + 0x1c8)) {
        return false;
      }
    }
    if (pQVar9 == pQVar7) {
      return false;
    }
  }
LAB_0060d82f:
  QGraphicsItem::setFocus(pQVar6,BacktabFocusReason - next);
  return true;
}

Assistant:

bool QGraphicsScene::focusNextPrevChild(bool next)
{
    Q_D(QGraphicsScene);

    QGraphicsItem *item = focusItem();
    if (item && !item->isWidget()) {
        // Tab out of the scene.
        return false;
    }
    if (!item) {
        if (d->lastFocusItem && !d->lastFocusItem->isWidget()) {
            // Restore focus to the last focusable non-widget item that had
            // focus.
            setFocusItem(d->lastFocusItem, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
            return true;
        }
        if (d->activePanel) {
            if (d->activePanel->flags() & QGraphicsItem::ItemIsFocusable) {
                setFocusItem(d->activePanel, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
                return true;
            }
            if (d->activePanel->isWidget()) {
                QGraphicsWidget *test = static_cast<QGraphicsWidget *>(d->activePanel);
                QGraphicsWidget *fw = next ? test->d_func()->focusNext : test->d_func()->focusPrev;
                do {
                    if (fw->focusPolicy() & Qt::TabFocus) {
                        setFocusItem(fw, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
                        return true;
                    }
                    fw = next ? fw->d_func()->focusNext : fw->d_func()->focusPrev;
                } while (fw != d->activePanel);
            }
        }
    }
    if (!item && !d->tabFocusFirst) {
        // No widgets...
        return false;
    }

    // The item must be a widget.
    QGraphicsWidget *widget = nullptr;
    if (!item) {
        widget = next ? d->tabFocusFirst : d->tabFocusFirst->d_func()->focusPrev;
    } else {
        QGraphicsWidget *test = static_cast<QGraphicsWidget *>(item);
        widget = next ? test->d_func()->focusNext : test->d_func()->focusPrev;
        if (!widget->panel() && ((next && widget == d->tabFocusFirst) || (!next && widget == d->tabFocusFirst->d_func()->focusPrev))) {
            // Tab out of the scene.
            return false;
        }
    }
    QGraphicsWidget *widgetThatHadFocus = widget;

    // Run around the focus chain until we find a widget that can take tab focus.
    do {
        if (widget->flags() & QGraphicsItem::ItemIsFocusable
            && widget->isEnabled() && widget->isVisibleTo(nullptr)
            && (widget->focusPolicy() & Qt::TabFocus)
            && (!item || !item->isPanel() || item->isAncestorOf(widget))
            ) {
            setFocusItem(widget, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
            return true;
        }
        widget = next ? widget->d_func()->focusNext : widget->d_func()->focusPrev;
        if ((next && widget == d->tabFocusFirst) || (!next && widget == d->tabFocusFirst->d_func()->focusPrev))
            return false;
    } while (widget != widgetThatHadFocus);

    return false;
}